

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O1

void BinaryenCallIndirectSetTarget(BinaryenExpressionRef expr,BinaryenExpressionRef targetExpr)

{
  if (expr->_id != CallIndirectId) {
    __assert_fail("expression->is<CallIndirect>()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x8fd,
                  "void BinaryenCallIndirectSetTarget(BinaryenExpressionRef, BinaryenExpressionRef)"
                 );
  }
  if (targetExpr != (BinaryenExpressionRef)0x0) {
    expr[3].type.id = (uintptr_t)targetExpr;
    return;
  }
  __assert_fail("targetExpr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x8fe,
                "void BinaryenCallIndirectSetTarget(BinaryenExpressionRef, BinaryenExpressionRef)");
}

Assistant:

void BinaryenCallIndirectSetTarget(BinaryenExpressionRef expr,
                                   BinaryenExpressionRef targetExpr) {
  auto* expression = (Expression*)expr;
  assert(expression->is<CallIndirect>());
  assert(targetExpr);
  static_cast<CallIndirect*>(expression)->target = (Expression*)targetExpr;
}